

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# difference_iterator.hpp
# Opt level: O0

void __thiscall
burst::
difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
::difference_iterator
          (difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
           *this,_List_node_base *minuend_begin,_List_node_base *minuend_end,int *subtrahend_begin,
          int *subtrahend_end)

{
  bool bVar1;
  difference_iterator<std::_List_const_iterator<int>,___gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>,_std::less<void>_>
  *this_local;
  subtrahend_iterator subtrahend_end_local;
  subtrahend_iterator subtrahend_begin_local;
  minuend_iterator minuend_end_local;
  minuend_iterator minuend_begin_local;
  
  (this->m_minuend_begin)._M_node = minuend_begin;
  (this->m_minuend_end)._M_node = minuend_end;
  (this->m_subtrahend_begin)._M_current = subtrahend_begin;
  (this->m_subtrahend_end)._M_current = subtrahend_end;
  bVar1 = std::is_sorted<std::_List_const_iterator<int>,std::less<void>>
                    ((this->m_minuend_begin)._M_node,(this->m_minuend_end)._M_node);
  if (!bVar1) {
    __assert_fail("std::is_sorted(m_minuend_begin, m_minuend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6b,
                  "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
                 );
  }
  bVar1 = std::
          is_sorted<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>,std::less<void>>
                    ((this->m_subtrahend_begin)._M_current,(this->m_subtrahend_end)._M_current);
  if (!bVar1) {
    __assert_fail("std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare)",
                  "/workspace/llm4binary/github/license_c_cmakelists/izvolov[P]burst/include/burst/iterator/difference_iterator.hpp"
                  ,0x6c,
                  "burst::difference_iterator<std::_List_const_iterator<int>, __gnu_cxx::__normal_iterator<const int *, std::vector<int>>>::difference_iterator(minuend_iterator, minuend_iterator, subtrahend_iterator, subtrahend_iterator, Compare) [ForwardIterator1 = std::_List_const_iterator<int>, ForwardIterator2 = __gnu_cxx::__normal_iterator<const int *, std::vector<int>>, Compare = std::less<void>]"
                 );
  }
  maintain_invariant(this);
  return;
}

Assistant:

difference_iterator
            (
                minuend_iterator minuend_begin,
                minuend_iterator minuend_end,
                subtrahend_iterator subtrahend_begin,
                subtrahend_iterator subtrahend_end,
                Compare compare = Compare()
            ):
            m_minuend_begin(std::move(minuend_begin)),
            m_minuend_end(std::move(minuend_end)),
            m_subtrahend_begin(std::move(subtrahend_begin)),
            m_subtrahend_end(std::move(subtrahend_end)),
            m_compare(compare)
        {
            BOOST_ASSERT(std::is_sorted(m_minuend_begin, m_minuend_end, compare));
            BOOST_ASSERT(std::is_sorted(m_subtrahend_begin, m_subtrahend_end, compare));

            maintain_invariant();
        }